

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O2

char * __thiscall google::protobuf::FieldDescriptor::index(FieldDescriptor *this,char *__s,int __c)

{
  long *plVar1;
  
  if (this[0x42] == (FieldDescriptor)0x0) {
    plVar1 = (long *)(*(long *)(this + 0x50) + 0x28);
  }
  else if (*(long *)(this + 0x60) == 0) {
    plVar1 = (long *)(*(long *)(this + 0x28) + 0x80);
  }
  else {
    plVar1 = (long *)(*(long *)(this + 0x60) + 0x50);
  }
  return (char *)(((long)this - *plVar1) / 0x98);
}

Assistant:

inline int FieldDescriptor::index() const {
  if (!is_extension_) {
    return static_cast<int>(this - containing_type()->fields_);
  } else if (extension_scope_ != nullptr) {
    return static_cast<int>(this - extension_scope_->extensions_);
  } else {
    return static_cast<int>(this - file_->extensions_);
  }
}